

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::checkElemTimeScale
          (Compilation *this,optional<slang::TimeScale> timeScale,SourceRange sourceRange)

{
  pointer puVar1;
  DefinitionSymbol *pDVar2;
  PackageSymbol *pPVar3;
  SyntaxNode *pSVar4;
  uint uVar5;
  ushort uVar6;
  optional<slang::TimeScale> timeScale_00;
  undefined8 uVar7;
  char_pointer puVar8;
  char_pointer puVar9;
  table_element_pointer ppVar10;
  unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_> *def;
  pointer puVar11;
  char_pointer puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  SourceRange SVar15;
  iterator iVar16;
  
  if (((uint5)timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale> & 0x100000000) == 0) {
    if (this->anyElemsWithTimescales != false) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x14000d,sourceRange);
      return;
    }
  }
  else if (this->anyElemsWithTimescales == false) {
    this->anyElemsWithTimescales = true;
    puVar1 = (this->definitionMemory).
             super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->definitionMemory).
                   super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1;
        puVar11 = puVar11 + 1) {
      pDVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
               .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
      timeScale_00.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale> =
           *(_Optional_base<slang::TimeScale,_true,_true> *)
            &(pDVar2->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>;
      SVar15 = parsing::Token::range
                         ((Token *)&(pDVar2->super_Symbol).originatingSyntax[3].parent[2].parent);
      checkElemTimeScale(this,timeScale_00,SVar15);
    }
    iVar16 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
             ::begin(&(this->packageMap).table_);
    if (iVar16.p_ != (table_element_pointer)0x0) {
LAB_0016839c:
      do {
        pPVar3 = (iVar16.p_)->second;
        pSVar4 = (pPVar3->super_Symbol).originatingSyntax;
        if (pSVar4 != (SyntaxNode *)0x0) {
          uVar7 = *(undefined8 *)&pPVar3->timeScale;
          SVar15 = parsing::Token::range((Token *)&pSVar4[3].parent[2].parent);
          checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar7,0),
                             SVar15);
        }
        puVar9 = iVar16.pc_ + 0x12;
        puVar12 = iVar16.pc_ + 2;
        while( true ) {
          puVar8 = puVar12;
          puVar12 = iVar16.pc_;
          ppVar10 = iVar16.p_ + 1;
          if (((uint)iVar16.pc_ & 0xf) == 0xe) break;
          iVar16.p_ = ppVar10;
          iVar16.pc_ = puVar12 + 1;
          puVar9 = puVar9 + 1;
          puVar12 = puVar8 + 1;
          if (puVar8[-1] != '\0') goto code_r0x001683d8;
        }
        auVar13[0] = -(*puVar8 == '\0');
        auVar13[1] = -(puVar8[1] == '\0');
        auVar13[2] = -(puVar8[2] == '\0');
        auVar13[3] = -(puVar8[3] == '\0');
        auVar13[4] = -(puVar8[4] == '\0');
        auVar13[5] = -(puVar8[5] == '\0');
        auVar13[6] = -(puVar8[6] == '\0');
        auVar13[7] = -(puVar8[7] == '\0');
        auVar13[8] = -(puVar8[8] == '\0');
        auVar13[9] = -(puVar8[9] == '\0');
        auVar13[10] = -(puVar8[10] == '\0');
        auVar13[0xb] = -(puVar8[0xb] == '\0');
        auVar13[0xc] = -(puVar8[0xc] == '\0');
        auVar13[0xd] = -(puVar8[0xd] == '\0');
        auVar13[0xe] = -(puVar8[0xe] == '\0');
        auVar13[0xf] = -(puVar8[0xf] == '\0');
        uVar6 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
        while (uVar6 == 0x7fff) {
          ppVar10 = ppVar10 + 0xf;
          auVar14[0] = -(*puVar9 == '\0');
          auVar14[1] = -(puVar9[1] == '\0');
          auVar14[2] = -(puVar9[2] == '\0');
          auVar14[3] = -(puVar9[3] == '\0');
          auVar14[4] = -(puVar9[4] == '\0');
          auVar14[5] = -(puVar9[5] == '\0');
          auVar14[6] = -(puVar9[6] == '\0');
          auVar14[7] = -(puVar9[7] == '\0');
          auVar14[8] = -(puVar9[8] == '\0');
          auVar14[9] = -(puVar9[9] == '\0');
          auVar14[10] = -(puVar9[10] == '\0');
          auVar14[0xb] = -(puVar9[0xb] == '\0');
          auVar14[0xc] = -(puVar9[0xc] == '\0');
          auVar14[0xd] = -(puVar9[0xd] == '\0');
          auVar14[0xe] = -(puVar9[0xe] == '\0');
          auVar14[0xf] = -(puVar9[0xf] == '\0');
          puVar8 = puVar9;
          puVar9 = puVar9 + 0x10;
          uVar6 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
        }
        uVar5 = 0;
        if ((uVar6 ^ 0x7fff) != 0) {
          for (; ((uVar6 ^ 0x7fff) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        if (puVar8[uVar5] == '\x01') {
          return;
        }
        iVar16.p_ = ppVar10 + uVar5;
        iVar16.pc_ = puVar8 + uVar5;
      } while( true );
    }
  }
  return;
code_r0x001683d8:
  if (puVar8[-1] == '\x01') {
    return;
  }
  iVar16.pc_ = puVar8 + -1;
  goto LAB_0016839c;
}

Assistant:

void Compilation::checkElemTimeScale(std::optional<TimeScale> timeScale, SourceRange sourceRange) {
    if (timeScale) {
        if (anyElemsWithTimescales)
            return;

        anyElemsWithTimescales = true;
        for (auto& def : definitionMemory) {
            auto& syntax = def->getSyntax()->as<ModuleDeclarationSyntax>();
            checkElemTimeScale(def->timeScale, syntax.header->name.range());
        }

        for (auto [name, package] : packageMap) {
            if (auto syntax = package->getSyntax()) {
                checkElemTimeScale(package->timeScale,
                                   syntax->as<ModuleDeclarationSyntax>().header->name.range());
            }
        }
    }
    else if (anyElemsWithTimescales) {
        root->addDiag(diag::MissingTimeScale, sourceRange);
    }
}